

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

AggregateInitialiserList * __thiscall
soul::HEARTGenerator::createAggregateInitialiserList
          (HEARTGenerator *this,Context *context,Type *targetType,CommaSeparatedList *list)

{
  AggregateInitialiserList *pAVar1;
  Structure *pSVar2;
  Member *pMVar3;
  long lVar4;
  ulong uVar5;
  Type elementType;
  pool_ref<soul::heart::Expression> local_90;
  Type local_88;
  pool_ptr<soul::AST::Expression> local_70;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_68;
  
  pAVar1 = PoolAllocator::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                     (&this->module->allocator->pool,&context->location,targetType);
  local_70.object = &list->super_Expression;
  AST::CommaSeparatedList::getAsExpressionList(&local_68,&local_70);
  uVar5 = 0;
  for (lVar4 = local_68.numActive << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
    if (targetType->category == structure) {
      pSVar2 = Type::getStructRef(targetType);
      pMVar3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                         (&pSVar2->members,uVar5 & 0xffffffff);
      Type::Type(&local_88,&pMVar3->type);
    }
    else {
      Type::getElementType(&local_88,targetType);
    }
    SanityCheckPass::expectSilentCastPossible
              (&((local_68.items[uVar5].object)->super_Statement).super_ASTObject.context,&local_88,
               local_68.items[uVar5].object);
    local_90.object = evaluateAsExpression(this,local_68.items[uVar5].object,&local_88);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&pAVar1->items,&local_90);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_88.structure);
    uVar5 = uVar5 + 1;
  }
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(&local_68);
  return pAVar1;
}

Assistant:

heart::AggregateInitialiserList& createAggregateInitialiserList (const AST::Context& context, const Type& targetType, AST::CommaSeparatedList& list)
    {
        auto& result = module.allocator.allocate<heart::AggregateInitialiserList> (context.location, targetType);
        uint32_t index = 0;

        for (auto& item : AST::CommaSeparatedList::getAsExpressionList (list))
        {
            auto elementType = targetType.isStruct() ? targetType.getStructRef().getMemberType (index)
                                                     : targetType.getElementType();

            SanityCheckPass::expectSilentCastPossible (item->context, elementType, item);
            result.items.push_back (evaluateAsExpression (item, elementType));
            ++index;
        }

        return result;
    }